

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O1

void __thiscall
StringWriter_ReadCharString_Test::~StringWriter_ReadCharString_Test
          (StringWriter_ReadCharString_Test *this)

{
  pointer puVar1;
  
  (this->super_StringWriter).super_Test._vptr_Test = (_func_int **)&PTR__StringWriter_00197180;
  pstore::serialize::archive::vector_writer::~vector_writer(&(this->super_StringWriter).writer_);
  puVar1 = (this->super_StringWriter).bytes_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_StringWriter).bytes_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (StringWriter, ReadCharString) {
    std::string const str{"hello"};
    pstore::serialize::write (writer_, str);

    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    std::string const actual = pstore::serialize::read<std::string> (archive);
    EXPECT_EQ (str, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}